

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

libcaption_stauts_t cea708_parse_h262(uint8_t *data,size_t size,cea708_t *cea708)

{
  user_data_t *in_RDX;
  ulong in_RSI;
  byte *in_RDI;
  libcaption_stauts_t local_4;
  
  if ((in_RDI == (byte *)0x0) || (in_RSI < 7)) {
    local_4 = LIBCAPTION_ERROR;
  }
  else {
    in_RDX->cc_data[1] =
         (cc_data_t)
         ((uint)*in_RDI << 0x18 | (uint)in_RDI[1] << 0x10 | (uint)in_RDI[2] << 8 | (uint)in_RDI[3]);
    *(byte *)(in_RDX->cc_data + 2) = in_RDI[4];
    if (*(char *)(in_RDX->cc_data + 2) == '\x03') {
      cea708_parse_user_data_type_strcture(in_RDI,in_RSI,in_RDX);
    }
    local_4 = LIBCAPTION_OK;
  }
  return local_4;
}

Assistant:

libcaption_stauts_t cea708_parse_h262(const uint8_t* data, size_t size, cea708_t* cea708)
{
    if (!data || 7 > size) {
        return LIBCAPTION_ERROR;
    }

    cea708->user_identifier = ((data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3]);
    cea708->user_data_type_code = data[4];
    if (3 == cea708->user_data_type_code) {
        cea708_parse_user_data_type_strcture(data + 5, size - 5, &cea708->user_data);
    }

    return LIBCAPTION_OK;
}